

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O1

void __thiscall
cmVirtualDirectoryWatcher::Trigger
          (cmVirtualDirectoryWatcher *this,string *pathSegment,int events,int status)

{
  const_iterator cVar1;
  _Hash_node_base *p_Var2;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (pathSegment->_M_string_length == 0) {
    p_Var2 = (this->Children)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      do {
        local_40 = 0;
        local_38 = 0;
        local_48 = &local_38;
        (*(code *)(p_Var2[5]._M_nxt)->_M_nxt[2]._M_nxt)(p_Var2[5]._M_nxt,&local_48,events,status);
        if (local_48 != &local_38) {
          operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
        }
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
    }
  }
  else {
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->Children)._M_h,pathSegment);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_40 = 0;
      local_38 = 0;
      local_48 = &local_38;
      (**(code **)(**(long **)((long)cVar1.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                     ._M_cur + 0x28) + 0x10))
                (*(long **)((long)cVar1.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>,_true>
                                  ._M_cur + 0x28),&local_48,events,status);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
    }
  }
  return;
}

Assistant:

void Trigger(const std::string& pathSegment, int events,
               int status) const final
  {
    if (pathSegment.empty()) {
      for (auto const& child : this->Children) {
        child.second->Trigger(std::string(), events, status);
      }
    } else {
      const auto i = this->Children.find(pathSegment);
      if (i != this->Children.end()) {
        i->second->Trigger(std::string(), events, status);
      }
    }
  }